

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O0

void __thiscall
ear::PolarExtent::PolarExtent(PolarExtent *this,shared_ptr<ear::PointSourcePanner> *psp_)

{
  unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_> local_20;
  shared_ptr<ear::PointSourcePanner> *local_18;
  shared_ptr<ear::PointSourcePanner> *psp__local;
  PolarExtent *this_local;
  
  local_18 = psp_;
  psp__local = (shared_ptr<ear::PointSourcePanner> *)this;
  get_polar_extent_core();
  PolarExtent(this,psp_,&local_20);
  std::unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

PolarExtent::PolarExtent(const std::shared_ptr<PointSourcePanner> &psp_)
      : PolarExtent(psp_, get_polar_extent_core()) {}